

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O1

void YM2612_Reset(ym2612_ *YM2612)

{
  bool bVar1;
  channel__ *pcVar2;
  int *piVar3;
  ym2612_ *pyVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  uint uVar8;
  
  YM2612->DAC = '\0';
  YM2612->DACdata = 0;
  YM2612->dac_highpass = 0;
  YM2612->Inter_Cnt = 0;
  YM2612->Status = 0;
  YM2612->OPNAadr = 0;
  YM2612->OPNBadr = 0;
  YM2612->LFOcnt = 0;
  YM2612->TimerA = 0;
  YM2612->TimerAL = 0;
  YM2612->TimerAcnt = 0;
  YM2612->TimerB = 0;
  YM2612->TimerBL = 0;
  YM2612->TimerBcnt = 0;
  piVar3 = &YM2612->CHANNEL[0].SLOT[0].ChgEnM;
  lVar5 = 0;
  pyVar4 = YM2612;
  do {
    pcVar2 = YM2612->CHANNEL + lVar5;
    pcVar2->Old_OUTd = 0;
    pcVar2->OUTd = 0;
    *(undefined8 *)(&pcVar2->Old_OUTd + 2) = 0xffffffffffffffff;
    pcVar2 = YM2612->CHANNEL + lVar5;
    pcVar2->ALGO = 0;
    pcVar2->FB = 0x1f;
    *(undefined8 *)(&pcVar2->ALGO + 2) = 0;
    lVar6 = 0x2c;
    piVar7 = piVar3;
    do {
      *(undefined4 *)((long)pyVar4 + lVar6 * 4 + -0x50) = 0;
      pyVar4->CHANNEL[0].S0_OUT[lVar6 + -0x20] = 0;
      pyVar4->CHANNEL[0].S0_OUT[lVar6 + -0x1c] = 0;
      pyVar4->CHANNEL[0].S0_OUT[lVar6 + -0x18] = 0;
      ((slot__ *)(piVar7 + -0x1f))->DT = YM2612->DT_TAB[0];
      *(undefined8 *)(piVar7 + -0xd) = 0;
      *(undefined8 *)(piVar7 + -0xb) = 0x2000000000000003;
      *(undefined8 *)(piVar7 + -9) = 0;
      *piVar7 = 0;
      piVar7 = piVar7 + 0x22;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x30);
    lVar5 = lVar5 + 1;
    piVar3 = piVar3 + 0xa2;
    pyVar4 = (ym2612_ *)&pyVar4->CHANNEL[0].SLOT[3].DR;
  } while (lVar5 != 6);
  memset(YM2612->REG,0xff,0x200);
  uVar8 = 0xb6;
  do {
    YM2612->OPNAadr = uVar8;
    YM2612_Write(YM2612,'\x01',0xc0);
    YM2612->OPNBadr = uVar8;
    YM2612_Write(YM2612,'\x03',0xc0);
    bVar1 = 0xb4 < uVar8;
    uVar8 = uVar8 - 1;
  } while (bVar1);
  uVar8 = 0xb2;
  do {
    YM2612->OPNAadr = uVar8;
    YM2612_Write(YM2612,'\x01','\0');
    YM2612->OPNBadr = uVar8;
    YM2612_Write(YM2612,'\x03','\0');
    bVar1 = 0x22 < uVar8;
    uVar8 = uVar8 - 1;
  } while (bVar1);
  YM2612->OPNAadr = 0x2a;
  YM2612_Write(YM2612,'\x01',0x80);
  return;
}

Assistant:

void YM2612_Reset(ym2612_ *YM2612)
{
  int i, j;

#if YM_DEBUG_LEVEL > 0
  fprintf(debug_file, "\n\nStarting reseting YM2612 ...\n\n");
#endif

  YM2612->LFOcnt = 0;
  YM2612->TimerA = 0;
  YM2612->TimerAL = 0;
  YM2612->TimerAcnt = 0;
  YM2612->TimerB = 0;
  YM2612->TimerBL = 0;
  YM2612->TimerBcnt = 0;
  YM2612->DAC = 0;
  YM2612->DACdata = 0;
  YM2612->dac_highpass = 0;

  YM2612->Status = 0;

  YM2612->OPNAadr = 0;
  YM2612->OPNBadr = 0;
  YM2612->Inter_Cnt = 0;

  for (i = 0; i < 6; i++)
  {
    YM2612->CHANNEL[i].Old_OUTd = 0;
    YM2612->CHANNEL[i].OUTd = 0;
    YM2612->CHANNEL[i].LEFT = 0xFFFFFFFF;
    YM2612->CHANNEL[i].RIGHT = 0xFFFFFFFF;
    YM2612->CHANNEL[i].ALGO = 0;
    YM2612->CHANNEL[i].FB = 31;
    YM2612->CHANNEL[i].FMS = 0;
    YM2612->CHANNEL[i].AMS = 0;

    for (j = 0 ;j < 4 ; j++)
    {
      YM2612->CHANNEL[i].S0_OUT[j] = 0;
      YM2612->CHANNEL[i].FNUM[j] = 0;
      YM2612->CHANNEL[i].FOCT[j] = 0;
      YM2612->CHANNEL[i].KC[j] = 0;

      YM2612->CHANNEL[i].SLOT[j].DT = YM2612->DT_TAB[0];
      YM2612->CHANNEL[i].SLOT[j].Fcnt = 0;
      YM2612->CHANNEL[i].SLOT[j].Finc = 0;
      YM2612->CHANNEL[i].SLOT[j].Ecnt = ENV_END;    // Put it at the end of Decay phase...
      YM2612->CHANNEL[i].SLOT[j].Einc = 0;
      YM2612->CHANNEL[i].SLOT[j].Ecmp = 0;
      YM2612->CHANNEL[i].SLOT[j].Ecurp = RELEASE;

      YM2612->CHANNEL[i].SLOT[j].ChgEnM = 0;
    }
  }

  for (i = 0; i < 0x100; i++)
  {
    YM2612->REG[0][i] = 0xFF;
    YM2612->REG[1][i] = 0xFF;
  }

  for (i = 0xB6; i >= 0xB4; i--)
  {
    YM2612_Write(YM2612, 0, (UINT8) i);
    YM2612_Write(YM2612, 1, 0xC0);
    YM2612_Write(YM2612, 2, (UINT8) i);
    YM2612_Write(YM2612, 3, 0xC0);
  }

  for (i = 0xB2; i >= 0x22; i--)
  {
    YM2612_Write(YM2612, 0, (UINT8) i);
    YM2612_Write(YM2612, 1, 0);
    YM2612_Write(YM2612, 2, (UINT8) i);
    YM2612_Write(YM2612, 3, 0);
  }

  YM2612_Write(YM2612, 0, 0x2A);
  YM2612_Write(YM2612, 1, 0x80);

#if YM_DEBUG_LEVEL > 0
  fprintf(debug_file, "\n\nFinishing reseting YM2612 ...\n\n");
#endif

  return;
}